

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExpressionRef
BinaryenAtomicWait(BinaryenModuleRef module,BinaryenExpressionRef ptr,BinaryenExpressionRef expected
                  ,BinaryenExpressionRef timeout,BinaryenType expectedType,char *memoryName)

{
  BinaryenType timeout_00;
  BinaryenExpressionRef expected_00;
  BinaryenExpressionRef ptr_00;
  AtomicWait *pAVar1;
  Name memory;
  Address local_50;
  Type local_48;
  Builder local_40;
  char *local_38;
  char *memoryName_local;
  BinaryenType expectedType_local;
  BinaryenExpressionRef timeout_local;
  BinaryenExpressionRef expected_local;
  BinaryenExpressionRef ptr_local;
  BinaryenModuleRef module_local;
  
  local_38 = memoryName;
  memoryName_local = (char *)expectedType;
  expectedType_local = (BinaryenType)timeout;
  timeout_local = expected;
  expected_local = ptr;
  ptr_local = (BinaryenExpressionRef)module;
  wasm::Builder::Builder(&local_40,module);
  ptr_00 = expected_local;
  expected_00 = timeout_local;
  timeout_00 = expectedType_local;
  wasm::Type::Type(&local_48,(TypeID)memoryName_local);
  wasm::Address::Address(&local_50,0);
  memory = getMemoryName((BinaryenModuleRef)ptr_local,local_38);
  pAVar1 = wasm::Builder::makeAtomicWait
                     (&local_40,ptr_00,expected_00,(Expression *)timeout_00,local_48,local_50,memory
                     );
  return (BinaryenExpressionRef)pAVar1;
}

Assistant:

BinaryenExpressionRef BinaryenAtomicWait(BinaryenModuleRef module,
                                         BinaryenExpressionRef ptr,
                                         BinaryenExpressionRef expected,
                                         BinaryenExpressionRef timeout,
                                         BinaryenType expectedType,
                                         const char* memoryName) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeAtomicWait((Expression*)ptr,
                      (Expression*)expected,
                      (Expression*)timeout,
                      Type(expectedType),
                      0,
                      getMemoryName(module, memoryName)));
}